

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argument_factory.hpp
# Opt level: O1

output_format __thiscall
boost::runtime::value_interpreter<boost::unit_test::output_format,_true>::interpret
          (value_interpreter<boost::unit_test::output_format,_true> *this,cstring *param_name,
          cstring *source)

{
  const_iterator cVar1;
  undefined **local_130;
  iterator local_128;
  iterator pvStack_120;
  undefined1 *local_118;
  undefined8 local_110;
  undefined1 local_108 [16];
  specific_param_error<boost::runtime::format_error,_boost::runtime::input_error> local_f8;
  format_error local_c0;
  specific_param_error<boost::runtime::format_error,_boost::runtime::input_error> local_88;
  format_error local_50;
  
  cVar1 = std::
          _Rb_tree<boost::unit_test::basic_cstring<const_char>,_std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>,_std::_Select1st<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>_>
          ::find((_Rb_tree<boost::unit_test::basic_cstring<const_char>,_std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>,_std::_Select1st<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>_>
                  *)this,source);
  if ((_Rb_tree_header *)cVar1._M_node !=
      &(this->m_name_to_value)._M_t._M_impl.super__Rb_tree_header) {
    return *(output_format *)&cVar1._M_node[1]._M_left;
  }
  local_118 = local_108;
  local_128 = param_name->m_begin;
  pvStack_120 = param_name->m_end;
  local_110 = 0;
  local_108[0] = 0;
  local_130 = &PTR__param_error_001cc128;
  specific_param_error<boost::runtime::format_error,boost::runtime::input_error>::operator<<
            ((format_error *)&local_f8,
             (specific_param_error<boost::runtime::format_error,boost::runtime::input_error> *)
             &local_130,source);
  specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>::operator<<
            (&local_c0,&local_f8," is not a valid enumeration value name for parameter ");
  specific_param_error<boost::runtime::format_error,boost::runtime::input_error>::operator<<
            ((format_error *)&local_88,
             (specific_param_error<boost::runtime::format_error,boost::runtime::input_error> *)
             &local_c0,param_name);
  specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>::operator<<
            (&local_50,&local_88,".");
  unit_test::ut_detail::throw_exception<boost::runtime::format_error>(&local_50);
}

Assistant:

EnumType        interpret( cstring param_name, cstring source ) const
    {
        typename std::map<cstring,EnumType>::const_iterator found = m_name_to_value.find( source );

        BOOST_TEST_I_ASSRT( found != m_name_to_value.end(),
                            format_error( param_name ) << source <<
                            " is not a valid enumeration value name for parameter " << param_name << "." );

        return found->second;
    }